

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void transpose8x8_sse2(__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,
                      __m128i *x6,__m128i *x7,__m128i *d0d1,__m128i *d2d3,__m128i *d4d5,
                      __m128i *d6d7)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 (*in_stack_00000030) [16];
  __m128i w7;
  __m128i w6;
  __m128i w5;
  __m128i w4;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  
  auVar1 = vpunpcklbw_avx(*in_RDI,*in_RSI);
  auVar2 = vpunpcklbw_avx(*in_RDX,*in_RCX);
  auVar3 = vpunpcklbw_avx(*in_R8,*in_R9);
  auVar4 = vpunpcklbw_avx((undefined1  [16])*x4,(undefined1  [16])*x3);
  auVar5 = vpunpcklwd_avx(auVar1,auVar2);
  auVar6 = vpunpcklwd_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpckldq_avx(auVar5,auVar6);
  *x2 = alVar7;
  alVar7 = (__m128i)vpunpckhdq_avx(auVar5,auVar6);
  *x1 = alVar7;
  auVar1 = vpunpckhwd_avx(auVar1,auVar2);
  auVar2 = vpunpckhwd_avx(auVar3,auVar4);
  alVar7 = (__m128i)vpunpckldq_avx(auVar1,auVar2);
  *x0 = alVar7;
  auVar1 = vpunpckhdq_avx(auVar1,auVar2);
  *in_stack_00000030 = auVar1;
  return;
}

Assistant:

static inline void transpose8x8_sse2(__m128i *x0, __m128i *x1, __m128i *x2,
                                     __m128i *x3, __m128i *x4, __m128i *x5,
                                     __m128i *x6, __m128i *x7, __m128i *d0d1,
                                     __m128i *d2d3, __m128i *d4d5,
                                     __m128i *d6d7) {
  __m128i w0, w1, w2, w3, w4, w5, w6, w7;
  // x0 00 01 02 03 04 05 06 07
  // x1 10 11 12 13 14 15 16 17
  w0 = _mm_unpacklo_epi8(
      *x0, *x1);  // 00 10 01 11 02 12 03 13 04 14 05 15 06 16 07 17

  // x2 20 21 22 23 24 25 26 27
  // x3 30 31 32 33 34 35 36 37
  w1 = _mm_unpacklo_epi8(
      *x2, *x3);  // 20 30 21 31 22 32 23 33 24 34 25 35 26 36 27 37

  // x4 40 41 42 43 44 45 46 47
  // x5  50 51 52 53 54 55 56 57
  w2 = _mm_unpacklo_epi8(
      *x4, *x5);  // 40 50 41 51 42 52 43 53 44 54 45 55 46 56 47 57

  // x6  60 61 62 63 64 65 66 67
  // x7 70 71 72 73 74 75 76 77
  w3 = _mm_unpacklo_epi8(
      *x6, *x7);  // 60 70 61 71 62 72 63 73 64 74 65 75 66 76 67 77

  w4 = _mm_unpacklo_epi16(
      w0, w1);  // 00 10 20 30 01 11 21 31 02 12 22 32 03 13 23 33
  w5 = _mm_unpacklo_epi16(
      w2, w3);  // 40 50 60 70 41 51 61 71 42 52 62 72 43 53 63 73

  *d0d1 = _mm_unpacklo_epi32(
      w4, w5);  // 00 10 20 30 40 50 60 70 01 11 21 31 41 51 61 71
  *d2d3 = _mm_unpackhi_epi32(
      w4, w5);  // 02 12 22 32 42 52 62 72 03 13 23 33 43 53 63 73

  w6 = _mm_unpackhi_epi16(
      w0, w1);  // 04 14 24 34 05 15 25 35 06 16 26 36 07 17 27 37
  w7 = _mm_unpackhi_epi16(
      w2, w3);  // 44 54 64 74 45 55 65 75 46 56 66 76 47 57 67 77

  *d4d5 = _mm_unpacklo_epi32(
      w6, w7);  // 04 14 24 34 44 54 64 74 05 15 25 35 45 55 65 75
  *d6d7 = _mm_unpackhi_epi32(
      w6, w7);  // 06 16 26 36 46 56 66 76 07 17 27 37 47 57 67 77
}